

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O2

bool __thiscall
bssl::ssl_is_valid_ech_config_list(bssl *this,Span<const_unsigned_char> ech_config_list)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  bool supported;
  CBS child;
  CBS cbs;
  ECHConfig ech_config;
  
  cbs.len = (size_t)ech_config_list.data_;
  cbs.data = (uint8_t *)this;
  iVar2 = CBS_get_u16_length_prefixed(&cbs,&child);
  bVar4 = false;
  if (((iVar2 != 0) && (bVar4 = false, child.len != 0)) && (cbs.len == 0)) {
    sVar3 = 1;
    do {
      bVar4 = sVar3 == 0;
      if (bVar4) {
        return bVar4;
      }
      ech_config.cipher_suites.data_ = (uchar *)0x0;
      ech_config.cipher_suites.size_ = 0;
      ech_config.public_name.data_ = (uchar *)0x0;
      ech_config.public_name.size_ = 0;
      ech_config.public_key.data_ = (uchar *)0x0;
      ech_config.public_key.size_ = 0;
      ech_config.raw.data_ = (uchar *)0x0;
      ech_config.raw.size_ = 0;
      ech_config.kem_id = 0;
      ech_config.maximum_name_length = '\0';
      ech_config.config_id = '\0';
      bVar1 = parse_ech_config(&child,&ech_config,&supported,false);
      Array<unsigned_char>::~Array(&ech_config.raw);
      sVar3 = child.len;
    } while (bVar1);
  }
  return bVar4;
}

Assistant:

bool ssl_is_valid_ech_config_list(Span<const uint8_t> ech_config_list) {
  CBS cbs = ech_config_list, child;
  if (!CBS_get_u16_length_prefixed(&cbs, &child) ||  //
      CBS_len(&child) == 0 ||                        //
      CBS_len(&cbs) > 0) {
    return false;
  }
  while (CBS_len(&child) > 0) {
    ECHConfig ech_config;
    bool supported;
    if (!parse_ech_config(&child, &ech_config, &supported,
                          /*all_extensions_mandatory=*/false)) {
      return false;
    }
  }
  return true;
}